

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::handleCoopMat2FunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *fnCandidate,TIntermTyped *result,
          TIntermNode *arguments)

{
  TInfoSink *pTVar1;
  TIntermediate *this_00;
  TSymbolTable *pTVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  long *plVar10;
  TString *pTVar11;
  TSymbol *pTVar12;
  undefined4 extraout_var_01;
  long lVar13;
  long *plVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TType *pTVar15;
  TType *right;
  long *plVar16;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  TPoolAllocator *pTVar17;
  TArraySizes *pTVar18;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  TIntermTyped *pTVar19;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  _func_int **pp_Var20;
  undefined4 extraout_var_26;
  char *pcVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  TIntermNode *pTVar25;
  undefined1 auVar26 [16];
  TType resultType;
  TType local_c8;
  undefined4 extraout_var_15;
  
  if ((arguments != (TIntermNode *)0x0) &&
     (iVar6 = (*arguments->_vptr_TIntermNode[6])(arguments), CONCAT44(extraout_var,iVar6) != 0)) {
    iVar6 = (*arguments->_vptr_TIntermNode[6])(arguments);
    lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 400))
                      ((long *)CONCAT44(extraout_var_00,iVar6));
    lVar13 = *(long *)(lVar9 + 8);
    if (*(long *)(lVar9 + 0x10) != lVar13) {
      uVar24 = 0;
      do {
        plVar16 = *(long **)(lVar13 + uVar24 * 8);
        plVar10 = (long *)(**(code **)(*plVar16 + 0x18))(plVar16);
        iVar6 = (**(code **)(*plVar10 + 0x100))(plVar10);
        if (iVar6 == 0x16) {
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.infoSink;
          this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          plVar10 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
          pTVar11 = (TString *)(**(code **)(*plVar10 + 0x198))(plVar10);
          TIntermediate::addToCallGraph(this_00,pTVar1,&this->currentCaller,pTVar11);
          iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
          if (((iVar6 == 0x14b) ||
              (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar6 == 0x14e)) ||
             (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 == 0x14f)) {
            pTVar2 = (this->super_TParseContextBase).symbolTable;
            plVar10 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
            pTVar11 = (TString *)(**(code **)(*plVar10 + 0x198))(plVar10);
            pTVar12 = TSymbolTable::find(pTVar2,pTVar11,(bool *)0x0,(bool *)0x0,(int *)0x0);
            iVar6 = (*pTVar12->_vptr_TSymbol[7])(pTVar12);
            plVar10 = (long *)CONCAT44(extraout_var_01,iVar6);
            iVar6 = (**(code **)(*plVar10 + 0x120))(plVar10);
            if (0 < iVar6) {
              iVar6 = 0;
              do {
                lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,iVar6);
                lVar13 = (**(code **)(**(long **)(lVar13 + 8) + 0x50))();
                if ((*(uint *)(lVar13 + 8) & 0x7f) != 0x13) {
                  plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
                  lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"function parameters must all be qualified \'const in\'",
                             *(undefined8 *)(lVar13 + 8));
                }
                iVar6 = iVar6 + 1;
                iVar7 = (**(code **)(*plVar10 + 0x120))(plVar10);
              } while (iVar6 < iVar7);
            }
          }
          iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
          if (iVar6 == 0x14b) {
            pTVar2 = (this->super_TParseContextBase).symbolTable;
            plVar10 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
            pTVar11 = (TString *)(**(code **)(*plVar10 + 0x198))(plVar10);
            pTVar12 = TSymbolTable::find(pTVar2,pTVar11,(bool *)0x0,(bool *)0x0,(int *)0x0);
            iVar6 = (*pTVar12->_vptr_TSymbol[7])(pTVar12);
            plVar10 = (long *)CONCAT44(extraout_var_02,iVar6);
            iVar6 = (**(code **)(*plVar10 + 0x120))(plVar10);
            if (iVar6 != 3) {
              plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
              lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"must have three parameters",*(undefined8 *)(lVar13 + 8));
            }
            lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,0);
            iVar6 = (**(code **)(**(long **)(lVar13 + 8) + 0x38))();
            if (iVar6 != 0x12) {
              plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
              lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"first parameter must be buffer reference type",
                         *(undefined8 *)(lVar13 + 8));
            }
            lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,1);
            iVar6 = (**(code **)(**(long **)(lVar13 + 8) + 0x38))();
            if (iVar6 == 9) {
              lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,2);
              iVar6 = (**(code **)(**(long **)(lVar13 + 8) + 0x38))();
              if (iVar6 != 9) goto LAB_0041e575;
            }
            else {
LAB_0041e575:
              plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
              lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"coordinate parameters must be uint32_t",
                         *(undefined8 *)(lVar13 + 8));
            }
            lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,1);
            cVar4 = (**(code **)(**(long **)(lVar13 + 8) + 0xe8))();
            if (cVar4 != '\0') {
              lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,2);
              cVar4 = (**(code **)(**(long **)(lVar13 + 8) + 0xe8))();
              if (cVar4 != '\0') goto LAB_0041e631;
            }
            plVar10 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
            lVar13 = (**(code **)(*plVar10 + 0x198))(plVar10);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"coordinate parameters must be uint32_t",*(undefined8 *)(lVar13 + 8)
                      );
          }
LAB_0041e631:
          iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
          if (iVar6 == 0x14e) {
            pTVar2 = (this->super_TParseContextBase).symbolTable;
            plVar10 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
            pTVar11 = (TString *)(**(code **)(*plVar10 + 0x198))(plVar10);
            pTVar12 = TSymbolTable::find(pTVar2,pTVar11,(bool *)0x0,(bool *)0x0,(int *)0x0);
            iVar6 = (*pTVar12->_vptr_TSymbol[7])(pTVar12);
            plVar10 = (long *)CONCAT44(extraout_var_03,iVar6);
            iVar6 = (**(code **)(*plVar10 + 0x120))(plVar10);
            if (iVar6 != 2) {
              plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
              lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"must have two parameters",*(undefined8 *)(lVar13 + 8));
            }
            iVar6 = (**(code **)(*plVar10 + 0x120))(plVar10);
            if (0 < iVar6) {
              iVar6 = 0;
              do {
                lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,iVar6);
                plVar14 = (long *)(**(code **)(**(long **)(*(long *)(lVar9 + 8) + 8) + 0x18))();
                plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
                iVar7 = (**(code **)(*plVar14 + 0x38))(plVar14);
                iVar8 = (**(code **)(**(long **)(lVar13 + 8) + 0x38))();
                if (iVar7 != iVar8) {
                  plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
                  lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"parameter types must match cooperative matrix component type"
                             ,*(undefined8 *)(lVar13 + 8));
                }
                iVar6 = iVar6 + 1;
                iVar7 = (**(code **)(*plVar10 + 0x120))(plVar10);
              } while (iVar6 < iVar7);
            }
            plVar14 = (long *)(**(code **)(**(long **)(*(long *)(lVar9 + 8) + 8) + 0x18))();
            plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
            iVar6 = (**(code **)(*plVar14 + 0x38))(plVar14);
            plVar10 = (long *)(**(code **)(*plVar10 + 0x60))(plVar10);
            iVar7 = (**(code **)(*plVar10 + 0x38))(plVar10);
            if (iVar6 != iVar7) {
              plVar10 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
              lVar13 = (**(code **)(*plVar10 + 0x198))(plVar10);
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"return type must match cooperative matrix component type",
                         *(undefined8 *)(lVar13 + 8));
            }
          }
          iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
          if (iVar6 == 0x14f) {
            pTVar2 = (this->super_TParseContextBase).symbolTable;
            plVar10 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
            pTVar11 = (TString *)(**(code **)(*plVar10 + 0x198))(plVar10);
            pTVar12 = TSymbolTable::find(pTVar2,pTVar11,(bool *)0x0,(bool *)0x0,(int *)0x0);
            iVar6 = (*pTVar12->_vptr_TSymbol[7])(pTVar12);
            plVar10 = (long *)CONCAT44(extraout_var_04,iVar6);
            plVar14 = (long *)(**(code **)(**(long **)(*(long *)(lVar9 + 8) + 8) + 0x18))();
            pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
            plVar14 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar9 + 8) + 0x18))();
            right = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
            bVar5 = TType::operator==(pTVar15,right);
            if (!bVar5) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"cooperative matrix input and result types must match");
            }
            iVar6 = (**(code **)(*plVar10 + 0x120))(plVar10);
            pcVar21 = "not enough parameters";
            if (2 < iVar6) {
              iVar6 = (**(code **)(*plVar10 + 0x120))(plVar10);
              pcVar21 = "number of parameters must match call to coopMatPerElementNV";
              if (iVar6 == (int)((ulong)(*(long *)(lVar9 + 0x10) - *(long *)(lVar9 + 8)) >> 3)) {
                lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,0);
                iVar6 = (**(code **)(**(long **)(lVar13 + 8) + 0x38))();
                if (iVar6 == 9) {
                  lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,1);
                  iVar6 = (**(code **)(**(long **)(lVar13 + 8) + 0x38))();
                  if (iVar6 != 9) goto LAB_0041e962;
                }
                else {
LAB_0041e962:
                  plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
                  lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"row/column parameters must be uint32_t",
                             *(undefined8 *)(lVar13 + 8));
                }
                lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,2);
                plVar14 = (long *)(**(code **)(**(long **)(*(long *)(lVar9 + 8) + 8) + 0x18))();
                plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
                iVar6 = (**(code **)(*plVar14 + 0x38))(plVar14);
                iVar7 = (**(code **)(**(long **)(lVar13 + 8) + 0x38))();
                if (iVar6 != iVar7) {
                  plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
                  lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,loc,"third parameter must match cooperative matrix component type"
                             ,*(undefined8 *)(lVar13 + 8));
                }
                iVar6 = (**(code **)(*plVar10 + 0x120))(plVar10);
                if (3 < iVar6) {
                  uVar22 = 3;
                  do {
                    lVar13 = (**(code **)(*plVar10 + 0x140))(plVar10,uVar22 & 0xffffffff);
                    plVar14 = (long *)(**(code **)(**(long **)(*(long *)(lVar9 + 8) + uVar22 * 8) +
                                                  0x18))();
                    plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
                    iVar6 = (**(code **)(*plVar14 + 0x38))(plVar14);
                    iVar7 = (**(code **)(**(long **)(lVar13 + 8) + 0x38))();
                    if (iVar6 != iVar7) {
                      plVar14 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
                      lVar13 = (**(code **)(*plVar14 + 0x198))(plVar14);
                      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                        [0x2d])(this,loc,
                                "parameter types must match or be cooperative matrix component type"
                                ,*(undefined8 *)(lVar13 + 8));
                    }
                    uVar22 = uVar22 + 1;
                    iVar6 = (**(code **)(*plVar10 + 0x120))(plVar10);
                  } while ((long)uVar22 < (long)iVar6);
                }
                plVar14 = (long *)(**(code **)(**(long **)(*(long *)(lVar9 + 8) + 8) + 0x18))();
                plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
                iVar6 = (**(code **)(*plVar14 + 0x38))(plVar14);
                plVar10 = (long *)(**(code **)(*plVar10 + 0x60))(plVar10);
                iVar7 = (**(code **)(*plVar10 + 0x38))(plVar10);
                pcVar21 = "return type must match cooperative matrix component type";
                if (iVar6 == iVar7) goto LAB_0041eb6b;
              }
            }
            plVar16 = (long *)(**(code **)(*plVar16 + 0x60))(plVar16);
            lVar13 = (**(code **)(*plVar16 + 0x198))(plVar16);
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,pcVar21,*(undefined8 *)(lVar13 + 8));
          }
        }
LAB_0041eb6b:
        uVar24 = (ulong)((int)uVar24 + 1);
        lVar13 = *(long *)(lVar9 + 8);
      } while (uVar24 < (ulong)(*(long *)(lVar9 + 0x10) - lVar13 >> 3));
    }
  }
  iVar6 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
  lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar6) + 0xf0))
                     ((long *)CONCAT44(extraout_var_05,iVar6));
  if ((*(byte *)(lVar13 + 10) & 0x60) == 0) {
    iVar6 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
    plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_06,iVar6) + 0xf0))
                                ((long *)CONCAT44(extraout_var_06,iVar6));
    iVar6 = (**(code **)(*plVar16 + 0x38))(plVar16);
    if (iVar6 != 0x17) {
      iVar6 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar6) + 0xf0))
                                  ((long *)CONCAT44(extraout_var_07,iVar6));
      iVar6 = (**(code **)(*plVar16 + 0x38))(plVar16);
      if (iVar6 != 0x18) {
        return;
      }
    }
  }
  iVar6 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
  plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar6) + 0xf0))
                              ((long *)CONCAT44(extraout_var_08,iVar6));
  cVar4 = (**(code **)(*plVar16 + 0x188))(plVar16);
  if (cVar4 == '\0') {
    iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
    if ((((iVar6 != 0x148) &&
         (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar6 != 0x14d))
        && ((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
            iVar6 != 0x14e &&
            ((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 != 0x14f &&
             (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 != 0x150)))))) &&
       (((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar6 != 0x151
         && ((((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar6 != 0x153 &&
               (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar6 != 0x152)) &&
              (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar6 != 0x154)) &&
             ((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar6 != 0x155 &&
              (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar6 != 0x156)))))) &&
        (((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar6 != 0x157
          && ((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar6 != 0x158 &&
              (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar6 != 0x159)))) &&
         (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate), iVar6 != 0x15a))
        )))) {
      __assert_fail("fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAdd || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAddNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV || fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV || fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV || fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV || fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV || fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                    ,0x672,
                    "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                   );
    }
    iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
    if (iVar6 == 0x151) {
      pTVar17 = GetThreadPoolAllocator();
      pTVar18 = (TArraySizes *)TPoolAllocator::allocate(pTVar17,0x18);
      (pTVar18->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_009237c8;
      (pTVar18->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      pTVar18->implicitArraySize = 0;
      pTVar18->implicitlySized = true;
      pTVar18->variablyIndexed = false;
      uVar24 = 0;
      bVar5 = true;
      do {
        bVar3 = bVar5;
        iVar6 = (*arguments->_vptr_TIntermNode[5])(arguments);
        if (CONCAT44(extraout_var_09,iVar6) == 0) {
          iVar6 = (*arguments->_vptr_TIntermNode[6])(arguments);
          if (CONCAT44(extraout_var_10,iVar6) == 0) {
            __assert_fail("arguments->getAsAggregate()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x67f,
                          "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                         );
          }
          iVar6 = (*arguments->_vptr_TIntermNode[6])(arguments);
          lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 400))
                             ((long *)CONCAT44(extraout_var_11,iVar6));
          if ((uVar24 < (ulong)(*(long *)(lVar13 + 0x10) - *(long *)(lVar13 + 8) >> 3)) &&
             (pTVar25 = *(TIntermNode **)(*(long *)(lVar13 + 8) + uVar24 * 8),
             pTVar25 != (TIntermNode *)0x0)) goto LAB_0041ee2e;
LAB_0041ee6d:
          uVar23 = 0;
LAB_0041ee72:
          pTVar19 = (TIntermTyped *)0x0;
        }
        else {
          pTVar25 = arguments;
          if (!bVar3) goto LAB_0041ee6d;
LAB_0041ee2e:
          iVar6 = (*pTVar25->_vptr_TIntermNode[3])(pTVar25);
          plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_12,iVar6) + 0xf0))
                                      ((long *)CONCAT44(extraout_var_12,iVar6));
          lVar13 = (**(code **)(*plVar16 + 0x58))(plVar16);
          if ((*(ulong *)(lVar13 + 8) & 0x100000000) == 0) {
            iVar6 = (*pTVar25->_vptr_TIntermNode[5])(pTVar25);
            uVar23 = **(uint **)(*(long *)(CONCAT44(extraout_var_13,iVar6) + 0xc0) + 8);
            goto LAB_0041ee72;
          }
          iVar6 = (*pTVar25->_vptr_TIntermNode[0xc])(pTVar25);
          uVar23 = **(uint **)(*(long *)(CONCAT44(extraout_var_14,iVar6) + 0x128) + 8);
          iVar6 = (*pTVar25->_vptr_TIntermNode[3])(pTVar25);
          pTVar19 = (TIntermTyped *)CONCAT44(extraout_var_15,iVar6);
        }
        TSmallArrayVector::push_back((TSmallArrayVector *)pTVar18,uVar23,pTVar19);
        uVar24 = 1;
        bVar5 = false;
      } while (bVar3);
      TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      iVar6 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      pTVar15 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_16,iVar6) + 0xf0))
                                   ((long *)CONCAT44(extraout_var_16,iVar6));
      TType::deepCopy(&local_c8,pTVar15);
      pTVar17 = GetThreadPoolAllocator();
      local_c8.typeParameters = (TTypeParameters *)TPoolAllocator::allocate(pTVar17,0x18);
      (local_c8.typeParameters)->basicType = EbtVoid;
      (local_c8.typeParameters)->arraySizes = pTVar18;
      (local_c8.typeParameters)->spirvType = (TSpirvType *)0x0;
      pp_Var20 = (result->super_TIntermNode)._vptr_TIntermNode;
    }
    else {
      iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
      if (iVar6 != 0x157) {
        iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate);
        if (((((iVar6 == 0x14e) ||
              (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar6 == 0x14f)) ||
             (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 == 0x150)) ||
            ((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 == 0x153 ||
             (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 == 0x152)))) ||
           ((((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
              iVar6 == 0x154 ||
              ((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar6 == 0x155 ||
               (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
               iVar6 == 0x156)))) ||
             (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 == 0x158)) ||
            ((iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 == 0x159 ||
             (iVar6 = (*(fnCandidate->super_TSymbol)._vptr_TSymbol[0x1b])(fnCandidate),
             iVar6 == 0x15a)))))) {
          iVar6 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(result);
          lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_24,iVar6) + 400))
                             ((long *)CONCAT44(extraout_var_24,iVar6));
          plVar16 = (long *)**(undefined8 **)(lVar13 + 8);
        }
        else {
          iVar6 = (*(result->super_TIntermNode)._vptr_TIntermNode[6])(result);
          lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_26,iVar6) + 400))
                             ((long *)CONCAT44(extraout_var_26,iVar6));
          plVar16 = *(long **)(*(long *)(lVar13 + 8) + 0x10);
        }
        plVar16 = (long *)(**(code **)(*plVar16 + 0x18))();
        auVar26 = (**(code **)(*plVar16 + 0xf0))(plVar16);
        UNRECOVERED_JUMPTABLE = (result->super_TIntermNode)._vptr_TIntermNode[0x1d];
        (*UNRECOVERED_JUMPTABLE)(result,auVar26._0_8_,auVar26._8_8_,UNRECOVERED_JUMPTABLE);
        return;
      }
      pTVar17 = GetThreadPoolAllocator();
      pTVar18 = (TArraySizes *)TPoolAllocator::allocate(pTVar17,0x18);
      (pTVar18->sizes)._vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_009237c8;
      (pTVar18->sizes).sizes = (TVector<glslang::TArraySize> *)0x0;
      pTVar18->implicitArraySize = 0;
      pTVar18->implicitlySized = true;
      pTVar18->variablyIndexed = false;
      uVar24 = 0;
      do {
        iVar6 = (*arguments->_vptr_TIntermNode[5])(arguments);
        if (CONCAT44(extraout_var_17,iVar6) == 0) {
          iVar6 = (*arguments->_vptr_TIntermNode[6])(arguments);
          if (CONCAT44(extraout_var_18,iVar6) == 0) {
            __assert_fail("arguments->getAsAggregate()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                          ,0x6a5,
                          "void glslang::TParseContext::handleCoopMat2FunctionCall(const TSourceLoc &, const TFunction *, TIntermTyped *, TIntermNode *)"
                         );
          }
          iVar6 = (*arguments->_vptr_TIntermNode[6])(arguments);
          lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar6) + 400))
                             ((long *)CONCAT44(extraout_var_19,iVar6));
          if (((ulong)(*(long *)(lVar13 + 0x10) - *(long *)(lVar13 + 8) >> 3) <= uVar24) ||
             (pTVar25 = *(TIntermNode **)(*(long *)(lVar13 + 8) + uVar24 * 8),
             pTVar25 == (TIntermNode *)0x0)) goto LAB_0041f029;
LAB_0041efed:
          iVar6 = (*pTVar25->_vptr_TIntermNode[3])(pTVar25);
          plVar16 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_20,iVar6) + 0xf0))
                                      ((long *)CONCAT44(extraout_var_20,iVar6));
          lVar13 = (**(code **)(*plVar16 + 0x58))(plVar16);
          if ((*(ulong *)(lVar13 + 8) & 0x100000000) == 0) {
            iVar6 = (*pTVar25->_vptr_TIntermNode[5])(pTVar25);
            uVar23 = **(uint **)(*(long *)(CONCAT44(extraout_var_21,iVar6) + 0xc0) + 8);
            goto LAB_0041f035;
          }
          iVar6 = (*pTVar25->_vptr_TIntermNode[0xc])(pTVar25);
          uVar23 = **(uint **)(*(long *)(CONCAT44(extraout_var_22,iVar6) + 0x128) + 8);
          iVar6 = (*pTVar25->_vptr_TIntermNode[3])(pTVar25);
          pTVar19 = (TIntermTyped *)CONCAT44(extraout_var_23,iVar6);
        }
        else {
          pTVar25 = arguments;
          if (uVar24 == 0) goto LAB_0041efed;
LAB_0041f029:
          uVar23 = (int)uVar24 - 2;
          if (uVar24 < 2) {
            uVar23 = 0;
          }
LAB_0041f035:
          pTVar19 = (TIntermTyped *)0x0;
        }
        TSmallArrayVector::push_back((TSmallArrayVector *)pTVar18,uVar23,pTVar19);
        uVar24 = uVar24 + 1;
      } while (uVar24 != 7);
      TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      iVar6 = (*(result->super_TIntermNode)._vptr_TIntermNode[3])(result);
      pTVar15 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_25,iVar6) + 0xf0))
                                   ((long *)CONCAT44(extraout_var_25,iVar6));
      TType::deepCopy(&local_c8,pTVar15);
      pTVar17 = GetThreadPoolAllocator();
      local_c8.typeParameters = (TTypeParameters *)TPoolAllocator::allocate(pTVar17,0x18);
      (local_c8.typeParameters)->basicType = EbtVoid;
      (local_c8.typeParameters)->arraySizes = pTVar18;
      (local_c8.typeParameters)->spirvType = (TSpirvType *)0x0;
      pp_Var20 = (result->super_TIntermNode)._vptr_TIntermNode;
    }
    (*pp_Var20[0x1d])(result,&local_c8);
  }
  return;
}

Assistant:

void TParseContext::handleCoopMat2FunctionCall(const TSourceLoc& loc, const TFunction* fnCandidate, TIntermTyped* result, TIntermNode* arguments)
{
    if (arguments && arguments->getAsAggregate()) {
        auto &sequence = arguments->getAsAggregate()->getSequence();
        for (uint32_t i = 0; i < sequence.size(); ++i) {
            auto param = sequence[i];
            if (param->getAsTyped()->getBasicType() == EbtFunction) {
                // Add the function to the callgraph
                intermediate.addToCallGraph(infoSink, currentCaller, param->getAsSymbolNode()->getMangledName());

                // error checking that all parameters are 'const in'
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixLoadTensorNV ||
                    fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
                    fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV) {
                    const TFunction* func = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();
                    for (int i = 0; i < func->getParamCount(); ++i) {
                        const TParameter& arg = (*func)[i];
                        const TQualifier& formalQualifier = arg.type->getQualifier();
                        if (formalQualifier.storage != EvqConstReadOnly) {
                            error(loc, "function parameters must all be qualified 'const in'", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                }

                // error checking decodeFunc parameters are (reference, uint32_t[], uint32_t[])
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixLoadTensorNV) {
                    const TFunction* decodeFunc = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (decodeFunc->getParamCount() != 3) {
                        error(loc, "must have three parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }

                    if ((*decodeFunc)[0].type->getBasicType() != EbtReference) {
                        error(loc, "first parameter must be buffer reference type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                    if ((*decodeFunc)[1].type->getBasicType() != EbtUint || (*decodeFunc)[2].type->getBasicType() != EbtUint) {
                        error(loc, "coordinate parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                    if (!(*decodeFunc)[1].type->isArray() || !(*decodeFunc)[2].type->isArray()) {
                        error(loc, "coordinate parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                }

                // error checking reduce function has matching parameters
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV) {
                    const TFunction* combineOp = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (combineOp->getParamCount() != 2) {
                        error(loc, "must have two parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }

                    for (int i = 0; i < combineOp->getParamCount(); ++i) {
                        const TParameter& arg = (*combineOp)[i];
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != arg.type->getBasicType()) {
                            error(loc, "parameter types must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                    if (sequence[1]->getAsTyped()->getType().getBasicType() != combineOp->getType().getBasicType()) {
                        error(loc, "return type must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    }
                }

                // error checking perelement op has correct parameters
                if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV) {
                    const TFunction* elemOp = symbolTable.find(param->getAsSymbolNode()->getMangledName())->getAsFunction();

                    if (sequence[1]->getAsTyped()->getType() != sequence[0]->getAsTyped()->getType()) {
                        error(loc, "cooperative matrix input and result types must match", "", "");
                    }

                    if (elemOp->getParamCount() < 3) {
                        error(loc, "not enough parameters", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    } else if (elemOp->getParamCount() != (int)sequence.size()) {
                        error(loc, "number of parameters must match call to coopMatPerElementNV", param->getAsSymbolNode()->getMangledName().c_str(), "");
                    } else {
                        if ((*elemOp)[0].type->getBasicType() != EbtUint || (*elemOp)[1].type->getBasicType() != EbtUint) {
                            error(loc, "row/column parameters must be uint32_t", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }

                        const TParameter& matArg = (*elemOp)[2];
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != matArg.type->getBasicType()) {
                            error(loc, "third parameter must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }

                        for (int i = 3; i < elemOp->getParamCount(); ++i) {
                            const TParameter& arg = (*elemOp)[i];
                            if (sequence[i]->getAsTyped()->getType().getBasicType() != arg.type->getBasicType()) {
                                error(loc, "parameter types must match or be cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                            }
                        }
                        if (sequence[1]->getAsTyped()->getType().getBasicType() != elemOp->getType().getBasicType()) {
                            error(loc, "return type must match cooperative matrix component type", param->getAsSymbolNode()->getMangledName().c_str(), "");
                        }
                    }
                }
            }
        }
    }
    if ((result->getAsTyped()->getType().isCoopMat() ||
         result->getAsTyped()->getType().isTensorLayoutNV() ||
         result->getAsTyped()->getType().isTensorViewNV()) &&
       !result->getAsTyped()->getType().isParameterized()) {
        assert(fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAdd ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixMulAddNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV ||
               fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV ||
               fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV ||
               fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV ||
               fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV ||
               fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV);

        if (fnCandidate->getBuiltInOp() == EOpCreateTensorLayoutNV) {

            // Convert template parameters to arraySizes/typeParameters
            TArraySizes *arraySizes = new TArraySizes;
            for (uint32_t i = 0; i < 2; ++i) {
                TIntermNode *param {};
                if (arguments->getAsConstantUnion()) {
                    if (i == 0) {
                        param = arguments;
                    }
                } else {
                    assert(arguments->getAsAggregate());
                    auto &sequence = arguments->getAsAggregate()->getSequence();
                    if (i < sequence.size()) {
                        param = sequence[i];
                    }
                }
                if (param) {
                    if (param->getAsTyped()->getType().getQualifier().isSpecConstant()) {
                        uint32_t value = param->getAsSymbolNode()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value, param->getAsTyped());
                    } else {
                        uint32_t value = param->getAsConstantUnion()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value);
                    }
                } else {
                    // gl_CooperativeMatrixClampModeUndefined
                    arraySizes->addInnerSize(0);
                }
            }
            TTypeParameters typeParameters;
            typeParameters.arraySizes = arraySizes;

            TType resultType;
            resultType.deepCopy(result->getAsTyped()->getType());

            resultType.copyTypeParameters(typeParameters);
            result->setType(resultType);
        } else if (fnCandidate->getBuiltInOp() == EOpCreateTensorViewNV) {

            // Convert template parameters to arraySizes/typeParameters
            TArraySizes *arraySizes = new TArraySizes;
            for (uint32_t i = 0; i < 7; ++i) {
                TIntermNode *param {};
                if (arguments->getAsConstantUnion()) {
                    if (i == 0) {
                        param = arguments;
                    }
                } else {
                    assert(arguments->getAsAggregate());
                    auto &sequence = arguments->getAsAggregate()->getSequence();
                    if (i < sequence.size()) {
                        param = sequence[i];
                    }
                }
                if (param) {
                    if (param->getAsTyped()->getType().getQualifier().isSpecConstant()) {
                        uint32_t value = param->getAsSymbolNode()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value, param->getAsTyped());
                    } else {
                        uint32_t value = param->getAsConstantUnion()->getConstArray()[0].getIConst();
                        arraySizes->addInnerSize(value);
                    }
                } else {
                    uint32_t value = 0;
                    if (i >= 2) {
                        // default permutation values are an increasing sequence
                        value = i - 2;
                    }
                    arraySizes->addInnerSize(value);
                }
            }
            TTypeParameters typeParameters;
            typeParameters.arraySizes = arraySizes;

            TType resultType;
            resultType.deepCopy(result->getAsTyped()->getType());

            resultType.copyTypeParameters(typeParameters);
            result->setType(resultType);
        } else if (fnCandidate->getBuiltInOp() == EOpCooperativeMatrixReduceNV ||
                   fnCandidate->getBuiltInOp() == EOpCooperativeMatrixPerElementOpNV ||
                   fnCandidate->getBuiltInOp() == EOpCooperativeMatrixTransposeNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetDimensionNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetBlockSizeNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetStrideNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSliceNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorLayoutSetClampValueNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetDimensionNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetStrideNV ||
                   fnCandidate->getBuiltInOp() == EOpTensorViewSetClipNV) {
            // Set result type to match type of first parameter
            result->setType(result->getAsAggregate()->getSequence()[0]->getAsTyped()->getType());
        } else {
            // For MulAdd, set result type to match type of C parameter
            result->setType(result->getAsAggregate()->getSequence()[2]->getAsTyped()->getType());
        }
    }
}